

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O0

void __thiscall
QMetaCallEvent::QMetaCallEvent
          (QMetaCallEvent *this,SlotObjUniquePtr *slotO,QObject *sender,int signalId,void **args,
          QSemaphore *semaphore)

{
  unique_ptr<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter> *in_RSI;
  QObject *in_RDI;
  _func_int **in_R8;
  QAbstractMetaCallEvent *in_R9;
  unique_ptr<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter>
  *in_stack_ffffffffffffffb8;
  
  QAbstractMetaCallEvent::QAbstractMetaCallEvent
            (in_R9,in_RDI,(int)((ulong)in_RSI >> 0x20),(QSemaphore *)in_stack_ffffffffffffffb8);
  in_RDI->_vptr_QObject = (_func_int **)&PTR__QMetaCallEvent_00be7348;
  std::unique_ptr<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter>::unique_ptr
            (in_RSI,in_stack_ffffffffffffffb8);
  in_RDI[3]._vptr_QObject = in_R8;
  in_RDI[3].d_ptr.d = (QObjectData *)0x0;
  *(undefined4 *)&in_RDI[4]._vptr_QObject = 0;
  *(undefined2 *)((long)&in_RDI[4]._vptr_QObject + 4) = 0;
  *(undefined2 *)((long)&in_RDI[4]._vptr_QObject + 6) = 0xffff;
  memset(&in_RDI[4].d_ptr,0,0x30);
  return;
}

Assistant:

QMetaCallEvent::QMetaCallEvent(QtPrivate::SlotObjUniquePtr slotO,
                               const QObject *sender, int signalId,
                               void **args, QSemaphore *semaphore)
    : QAbstractMetaCallEvent(sender, signalId, semaphore),
      d{std::move(slotO), args, nullptr, 0, 0, ushort(-1)},
      prealloc_()
{
}